

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
Validator_resetOrderVariableSetInComponentNotUnique_Test::
~Validator_resetOrderVariableSetInComponentNotUnique_Test
          (Validator_resetOrderVariableSetInComponentNotUnique_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, resetOrderVariableSetInComponentNotUnique)
{
    const std::vector<std::string> expectedIssues = {
        "Variable 'A' used in resets does not have unique order values across the equivalent variable set.",
    };

    libcellml::ValidatorPtr v = libcellml::Validator::create();

    auto m = setupResetOrderModel();

    auto c = m->component(0);
    auto r = c->reset(1);
    r->setOrder(1);

    v->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssues, v);
}